

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_>::ClearNodeVector
          (TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_> *this)

{
  Node *block;
  long lVar1;
  hash_t i;
  ulong uVar2;
  
  lVar1 = 0x30;
  for (uVar2 = 0; block = this->Nodes, uVar2 < this->Size; uVar2 = uVar2 + 1) {
    if (*(long *)((long)(&block->Pair + -1) + lVar1) != 1) {
      FString::~FString((FString *)((long)(block->Pair).Value.args + lVar1 + -0x18));
    }
    lVar1 = lVar1 + 0x40;
  }
  M_Free(block);
  this->Nodes = (Node *)0x0;
  this->LastFree = (Node *)0x0;
  this->Size = 0;
  this->NumUsed = 0;
  return;
}

Assistant:

void ClearNodeVector()
	{
		for (hash_t i = 0; i < Size; ++i)
		{
			if (!Nodes[i].IsNil())
			{
				Nodes[i].~Node();
			}
		}
		M_Free(Nodes);
		Nodes = NULL;
		Size = 0;
		LastFree = NULL;
		NumUsed = 0;
	}